

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O1

void result_tests::ExpectSuccess<result_tests::NoCopy,int>
               (Result<result_tests::NoCopy> *result,bilingual_str *str,int *args)

{
  int iVar1;
  _Head_base<0UL,_int_*,_false> *p_Var2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  _Head_base<0UL,_int_*,_false> local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  _Head_base<0UL,_int_*,_false> local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  _Head_base<0UL,_int_*,_false> *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  _Head_base<0UL,_int_*,_false> **local_90;
  _Head_base<0UL,_int_*,_false> *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  _Head_base<0UL,_int_*,_false> **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<result_tests::NoCopy>(result,true,str);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x41;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(__index_type *)
         ((long)&(result->m_variant).super__Variant_base<bilingual_str,_result_tests::NoCopy>.
                 super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
                 super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
                 super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                 super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                 super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x40) == '\x01'
       );
  local_88 = &local_118;
  local_118._M_head_impl._0_1_ =
       (class_property<bool>)
       (class_property<bool>)
       local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value;
  local_b0 = &local_140;
  local_140._M_head_impl._0_1_ = 1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  local_a0 = 0;
  local_80 = &PTR__lazy_ostream_013d4010;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &PTR__lazy_ostream_013d4010;
  local_90 = &local_b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xeea5d4,(size_t)&local_60,0x41,&local_80,"true",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x42;
  file_00.m_begin = (iterator)&local_100;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
             msg_00);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  p_Var2 = (_Head_base<0UL,_int_*,_false> *)util::Result<result_tests::NoCopy>::value(result);
  iVar1 = *args;
  local_118._M_head_impl = (int *)operator_new(4);
  *local_118._M_head_impl = iVar1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(((unique_ptr<int,_std::default_delete<int>_> *)&p_Var2->_M_head_impl)->_M_t).
         super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl == iVar1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_58 = "";
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d6c18;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d6c18;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_b0 = &local_118;
  local_88 = p_Var2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xeea607,(size_t)&local_60,0x42,&local_80,
             "T{std::forward<Args>(args)...}",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (local_118._M_head_impl != (int *)0x0) {
    operator_delete(local_118._M_head_impl,4);
  }
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_128;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_118._M_head_impl = (int *)util::Result<result_tests::NoCopy>::value(result);
  local_140._M_head_impl = (int *)util::Result<result_tests::NoCopy>::value(result);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118._M_head_impl == local_140._M_head_impl);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_58 = "";
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d6c58;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_140;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d6c58;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_88 = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xeea606,(size_t)&local_60,0x43,&local_80,"&*result",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}